

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_enc.c
# Opt level: O1

int rateallocate(jpc_enc_t *enc,uint numlyrs,uint_fast32_t *cumlens)

{
  jpc_flt_t *pjVar1;
  jpc_enc_tile_t *pjVar2;
  int iVar3;
  int iVar4;
  jas_stream_t *stream;
  jpc_enc_rlvl_t *pjVar5;
  jpc_enc_band_t *pjVar6;
  jpc_enc_pass_t *pjVar7;
  jpc_enc_tcmpt_t *pjVar8;
  jpc_enc_pass_t *pjVar9;
  ulong uVar10;
  jpc_enc_tcmpt_t *pjVar11;
  jpc_enc_band_t *pjVar12;
  jpc_enc_prc_t *pjVar13;
  long lVar14;
  jpc_enc_tcmpt_t *pjVar15;
  jpc_enc_rlvl_t *pjVar16;
  uint uVar17;
  uint uVar18;
  jpc_enc_pass_t *pjVar19;
  uint uVar20;
  undefined8 uVar21;
  uint uVar22;
  jpc_enc_cblk_t *pjVar23;
  jpc_enc_pass_t *pjVar24;
  jpc_enc_pass_t *pjVar25;
  ulong uVar26;
  ulong uVar27;
  uint *puVar28;
  uint uVar29;
  jpc_enc_cblk_t *pjVar30;
  bool bVar31;
  bool bVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double local_88;
  double local_80;
  double local_78;
  
  iVar3 = jas_getdbglevel();
  if (9 < iVar3) {
    jas_eprintf("starting rate allocation\n");
  }
  pjVar2 = enc->curtile;
  if (1 < numlyrs - 1) {
    lVar14 = 0;
    do {
      if (cumlens[lVar14 + 1] < cumlens[lVar14]) {
LAB_00122441:
        abort();
      }
      lVar14 = lVar14 + 1;
    } while (numlyrs - 2 != (int)lVar14);
  }
  stream = jas_stream_memopen((char *)0x0,0);
  if (stream == (jas_stream_t *)0x0) {
    return -1;
  }
  if ((ulong)pjVar2->numtcmpts == 0) {
    dVar33 = 1.79769313486232e+308;
    dVar34 = 0.0;
  }
  else {
    pjVar11 = pjVar2->tcmpts;
    pjVar15 = pjVar11 + pjVar2->numtcmpts;
    dVar33 = 1.79769313486232e+308;
    dVar34 = 0.0;
    do {
      if ((ulong)pjVar11->numrlvls != 0) {
        pjVar16 = pjVar11->rlvls;
        pjVar5 = pjVar16 + pjVar11->numrlvls;
        do {
          pjVar12 = pjVar16->bands;
          if ((pjVar12 != (jpc_enc_band_t *)0x0) && ((ulong)pjVar16->numbands != 0)) {
            pjVar6 = pjVar12 + pjVar16->numbands;
            do {
              if ((pjVar12->data != (jas_matrix_t *)0x0) && (uVar17 = pjVar16->numprcs, uVar17 != 0)
                 ) {
                pjVar13 = pjVar12->prcs;
                uVar20 = 0;
                do {
                  pjVar23 = pjVar13->cblks;
                  if ((pjVar23 != (jpc_enc_cblk_t *)0x0) && ((ulong)pjVar13->numcblks != 0)) {
                    pjVar30 = pjVar23 + pjVar13->numcblks;
                    do {
                      uVar27 = (ulong)pjVar23->numpasses;
                      if (uVar27 != 0) {
                        pjVar25 = pjVar23->passes;
                        dVar35 = 0.0;
                        pjVar7 = (jpc_enc_pass_t *)0x0;
                        pjVar19 = pjVar25;
                        pjVar24 = pjVar25;
LAB_00121a57:
                        do {
                          dVar36 = pjVar24->cumwmsedec;
                          lVar14 = (long)pjVar24->end;
                          if (pjVar7 != (jpc_enc_pass_t *)0x0) {
                            dVar36 = dVar36 - pjVar7->cumwmsedec;
                            lVar14 = lVar14 - pjVar7->end;
                          }
                          if (dVar36 <= 0.0) {
                            pjVar24->rdslope = -1.0;
                            if (pjVar19 <= pjVar24) {
                              pjVar19 = pjVar24 + 1;
                            }
LAB_00121ad1:
                            pjVar24 = pjVar24 + 1;
                            if (pjVar24 != pjVar25 + uVar27) goto LAB_00121a57;
                          }
                          else {
                            if ((pjVar24 < pjVar19) && (pjVar24->rdslope <= 0.0)) goto LAB_00121ad1;
                            if (lVar14 == 0) {
                              if (pjVar7 == (jpc_enc_pass_t *)0x0) {
                                __assert_fail("pass0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                                              ,0x5f7,"void calcrdslopes(jpc_enc_cblk_t *)");
                              }
                            }
                            else {
                              dVar36 = dVar36 / (double)lVar14;
                              if ((pjVar7 == (jpc_enc_pass_t *)0x0) || (dVar36 < dVar35)) {
                                pjVar24->rdslope = dVar36;
                                pjVar7 = pjVar24;
                                dVar35 = dVar36;
                                if (pjVar19 <= pjVar24) {
                                  pjVar19 = pjVar24 + 1;
                                }
                                goto LAB_00121ad1;
                              }
                            }
                            pjVar7->rdslope = 0.0;
                          }
                          pjVar7 = (jpc_enc_pass_t *)0x0;
                          pjVar24 = pjVar25;
                        } while (pjVar19 != pjVar25 + uVar27);
                        lVar14 = 0;
                        do {
                          dVar35 = *(double *)((long)&pjVar25->rdslope + lVar14);
                          dVar36 = dVar34;
                          if (0.0 < dVar35) {
                            dVar37 = dVar35;
                            if (dVar33 <= dVar35) {
                              dVar37 = dVar33;
                            }
                            dVar36 = dVar35;
                            dVar33 = dVar37;
                            if (dVar35 <= dVar34) {
                              dVar36 = dVar34;
                            }
                          }
                          dVar34 = dVar36;
                          lVar14 = lVar14 + 0x48;
                        } while (uVar27 * 0x48 != lVar14);
                      }
                      pjVar23 = pjVar23 + 1;
                    } while (pjVar23 != pjVar30);
                  }
                  uVar20 = uVar20 + 1;
                  pjVar13 = pjVar13 + 1;
                } while (uVar20 != uVar17);
              }
              pjVar12 = pjVar12 + 1;
            } while (pjVar12 != pjVar6);
          }
          pjVar16 = pjVar16 + 1;
        } while (pjVar16 != pjVar5);
      }
      pjVar11 = pjVar11 + 1;
    } while (pjVar11 != pjVar15);
  }
  if (9 < iVar3) {
    jas_eprintf("min rdslope = %f max rdslope = %f\n",dVar33,dVar34);
  }
  jpc_init_t2state(enc,1);
  bVar32 = numlyrs != 0;
  if (bVar32) {
    uVar27 = 0;
    do {
      local_88 = 0.0;
      uVar21 = 0;
      local_78 = dVar33;
      local_80 = dVar34;
      uVar17 = 0;
      while( true ) {
        uVar26 = cumlens[uVar27];
        uVar20 = (uint)uVar27;
        if (uVar26 == 0xffffffffffffffff) break;
        dVar35 = (local_80 + local_78) * 0.5;
        jpc_save_t2state(enc);
        lVar14 = jas_stream_tell(stream);
        if (lVar14 < 0) {
          __assert_fail("oldpos >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                        ,0x6bb,"int rateallocate(jpc_enc_t *, unsigned int, uint_fast32_t *)");
        }
        if ((ulong)pjVar2->numtcmpts != 0) {
          pjVar11 = pjVar2->tcmpts;
          pjVar8 = pjVar11 + pjVar2->numtcmpts;
          pjVar15 = pjVar11;
          do {
            if ((ulong)pjVar15->numrlvls != 0) {
              pjVar16 = pjVar15->rlvls;
              pjVar5 = pjVar16 + pjVar15->numrlvls;
              do {
                pjVar12 = pjVar16->bands;
                if ((pjVar12 != (jpc_enc_band_t *)0x0) && ((ulong)pjVar16->numbands != 0)) {
                  pjVar6 = pjVar12 + pjVar16->numbands;
                  do {
                    if ((pjVar12->data != (jas_matrix_t *)0x0) &&
                       (uVar29 = pjVar16->numprcs, uVar29 != 0)) {
                      pjVar13 = pjVar12->prcs;
                      uVar22 = 0;
                      do {
                        pjVar23 = pjVar13->cblks;
                        if ((pjVar23 != (jpc_enc_cblk_t *)0x0) && ((ulong)pjVar13->numcblks != 0)) {
                          pjVar30 = pjVar23 + pjVar13->numcblks;
                          do {
                            pjVar25 = pjVar23->curpass;
                            if (pjVar25 != (jpc_enc_pass_t *)0x0) {
                              uVar18 = pjVar23->numpasses;
                              pjVar7 = pjVar23->passes;
                              pjVar19 = pjVar25;
                              pjVar24 = pjVar25;
                              while (pjVar19 != pjVar7 + uVar18) {
                                pjVar9 = pjVar19 + 1;
                                pjVar1 = &pjVar19->rdslope;
                                pjVar19 = pjVar9;
                                if (dVar35 <= *pjVar1) {
                                  pjVar24 = pjVar9;
                                }
                              }
                              for (; pjVar25 != pjVar24; pjVar25 = pjVar25 + 1) {
                                pjVar25->lyrno = uVar20;
                              }
                              for (; pjVar25 != pjVar7 + uVar18; pjVar25 = pjVar25 + 1) {
                                pjVar25->lyrno = 0xffffffff;
                              }
                            }
                            pjVar23 = pjVar23 + 1;
                          } while (pjVar23 != pjVar30);
                        }
                        uVar22 = uVar22 + 1;
                        pjVar13 = pjVar13 + 1;
                      } while (uVar22 != uVar29);
                    }
                    pjVar12 = pjVar12 + 1;
                  } while (pjVar12 != pjVar6);
                }
                pjVar16 = pjVar16 + 1;
              } while (pjVar16 != pjVar5);
            }
            pjVar15 = pjVar15 + 1;
          } while (pjVar15 != pjVar8);
          do {
            if ((ulong)pjVar11->numrlvls != 0) {
              pjVar16 = pjVar11->rlvls;
              pjVar5 = pjVar16 + pjVar11->numrlvls;
              do {
                if ((pjVar16->bands != (jpc_enc_band_t *)0x0) && (pjVar16->numprcs != 0)) {
                  uVar29 = 0;
                  do {
                    iVar4 = jpc_enc_encpkt(enc,stream,
                                           (int)((ulong)((long)pjVar11 - (long)pjVar2->tcmpts) >> 3)
                                           * -0x55ee191,
                                           (int)((ulong)((long)pjVar16 - (long)pjVar11->rlvls) >> 3)
                                           * -0x3b13b13b,uVar29,uVar20);
                    if (iVar4 != 0) goto LAB_00122265;
                    uVar29 = uVar29 + 1;
                  } while (uVar29 < pjVar16->numprcs);
                }
                pjVar16 = pjVar16 + 1;
              } while (pjVar16 != pjVar5);
            }
            pjVar11 = pjVar11 + 1;
          } while (pjVar11 != pjVar8);
        }
        uVar10 = jas_stream_tell(stream);
        if ((long)uVar10 < 0) {
          __assert_fail("pos >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                        ,0x6fd,"int rateallocate(jpc_enc_t *, unsigned int, uint_fast32_t *)");
        }
        dVar36 = dVar35;
        if ((uVar10 <= uVar26) &&
           ((iVar4 = (int)uVar21, uVar21 = 1, local_80 = dVar35, dVar36 = local_78, iVar4 == 0 ||
            (dVar35 < local_88)))) {
          local_88 = dVar35;
        }
        local_78 = dVar36;
        jpc_restore_t2state(enc);
        lVar14 = jas_stream_seek(stream,lVar14,0);
        if (lVar14 < 0) goto LAB_00122441;
        if (9 < iVar3) {
          jas_eprintf("maxlen=%08ld actuallen=%08ld thresh=%f\n",dVar35,uVar26,uVar10);
        }
        if ((local_80 + -0.001 <= local_78) || (bVar31 = 0x1e < uVar17, uVar17 = uVar17 + 1, bVar31)
           ) goto LAB_00122017;
      }
      uVar21 = 1;
      local_88 = -1.0;
      if (uVar27 != numlyrs - 1) {
        __assert_fail("lyrno == numlyrs - 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_enc.c"
                      ,0x6b0,"int rateallocate(jpc_enc_t *, unsigned int, uint_fast32_t *)");
      }
LAB_00122017:
      if ((int)uVar21 == 0) {
        jas_eprintf("warning: empty layer generated\n");
      }
      if (9 < iVar3) {
        jas_eprintf("success %d goodthresh %f\n",local_88,uVar21);
      }
      if ((ulong)pjVar2->numtcmpts != 0) {
        pjVar11 = pjVar2->tcmpts;
        pjVar8 = pjVar11 + pjVar2->numtcmpts;
        pjVar15 = pjVar11;
        do {
          if ((ulong)pjVar15->numrlvls != 0) {
            pjVar16 = pjVar15->rlvls;
            pjVar5 = pjVar16 + pjVar15->numrlvls;
            do {
              pjVar12 = pjVar16->bands;
              if ((pjVar12 != (jpc_enc_band_t *)0x0) && ((ulong)pjVar16->numbands != 0)) {
                pjVar6 = pjVar12 + pjVar16->numbands;
                do {
                  if ((pjVar12->data != (jas_matrix_t *)0x0) &&
                     (uVar17 = pjVar16->numprcs, uVar17 != 0)) {
                    pjVar13 = pjVar12->prcs;
                    uVar29 = 0;
                    do {
                      pjVar23 = pjVar13->cblks;
                      if ((pjVar23 != (jpc_enc_cblk_t *)0x0) && ((ulong)pjVar13->numcblks != 0)) {
                        pjVar30 = pjVar23 + pjVar13->numcblks;
                        do {
                          pjVar25 = pjVar23->curpass;
                          if (pjVar25 != (jpc_enc_pass_t *)0x0) {
                            uVar22 = pjVar23->numpasses;
                            pjVar7 = pjVar23->passes;
                            pjVar24 = pjVar25;
                            pjVar19 = pjVar25;
                            if ((int)uVar21 != 0) {
                              while (pjVar19 != pjVar7 + uVar22) {
                                pjVar9 = pjVar19 + 1;
                                pjVar1 = &pjVar19->rdslope;
                                pjVar19 = pjVar9;
                                if (local_88 <= *pjVar1) {
                                  pjVar24 = pjVar9;
                                }
                              }
                            }
                            for (; pjVar25 != pjVar24; pjVar25 = pjVar25 + 1) {
                              pjVar25->lyrno = uVar20;
                            }
                            for (; pjVar25 != pjVar7 + uVar22; pjVar25 = pjVar25 + 1) {
                              pjVar25->lyrno = 0xffffffff;
                            }
                          }
                          pjVar23 = pjVar23 + 1;
                        } while (pjVar23 != pjVar30);
                      }
                      uVar29 = uVar29 + 1;
                      pjVar13 = pjVar13 + 1;
                    } while (uVar29 != uVar17);
                  }
                  pjVar12 = pjVar12 + 1;
                } while (pjVar12 != pjVar6);
              }
              pjVar16 = pjVar16 + 1;
            } while (pjVar16 != pjVar5);
          }
          pjVar15 = pjVar15 + 1;
        } while (pjVar15 != pjVar8);
        do {
          if ((ulong)pjVar11->numrlvls != 0) {
            pjVar16 = pjVar11->rlvls;
            pjVar5 = pjVar16 + pjVar11->numrlvls;
            do {
              if ((pjVar16->bands != (jpc_enc_band_t *)0x0) && (pjVar16->numprcs != 0)) {
                uVar17 = 0;
                do {
                  iVar4 = jpc_enc_encpkt(enc,stream,
                                         (int)((ulong)((long)pjVar11 - (long)pjVar2->tcmpts) >> 3) *
                                         -0x55ee191,
                                         (int)((ulong)((long)pjVar16 - (long)pjVar11->rlvls) >> 3) *
                                         -0x3b13b13b,uVar17,uVar20);
                  if (iVar4 != 0) goto LAB_00122265;
                  uVar17 = uVar17 + 1;
                } while (uVar17 < pjVar16->numprcs);
              }
              pjVar16 = pjVar16 + 1;
            } while (pjVar16 != pjVar5);
          }
          pjVar11 = pjVar11 + 1;
        } while (pjVar11 != pjVar8);
      }
      uVar27 = uVar27 + 1;
      bVar32 = uVar27 < numlyrs;
    } while (uVar27 != numlyrs);
  }
LAB_00122275:
  if ((4 < iVar3) && (pjVar2 = enc->curtile, pjVar2->numlyrs != 0)) {
    uVar17 = 0;
    do {
      jas_eprintf("lyrno = %02u\n",(ulong)uVar17);
      if (pjVar2->numtcmpts != 0) {
        pjVar11 = pjVar2->tcmpts;
        uVar20 = 0;
        do {
          if (pjVar11->numrlvls != 0) {
            pjVar16 = pjVar11->rlvls;
            uVar29 = 0;
            do {
              pjVar12 = pjVar16->bands;
              if ((pjVar12 != (jpc_enc_band_t *)0x0) && (pjVar16->numbands != 0)) {
                uVar22 = 0;
                do {
                  if ((pjVar12->data != (jas_matrix_t *)0x0) && (pjVar16->numprcs != 0)) {
                    pjVar13 = pjVar12->prcs;
                    uVar27 = 0;
                    do {
                      pjVar23 = pjVar13->cblks;
                      if ((pjVar23 != (jpc_enc_cblk_t *)0x0) && (pjVar13->numcblks != 0)) {
                        uVar26 = 0;
                        do {
                          if (pjVar23->numpasses != 0) {
                            puVar28 = &pjVar23->passes->lyrno;
                            uVar10 = 0;
                            do {
                              if (*puVar28 != uVar17) break;
                              jas_eprintf("lyrno=%02d cmptno=%02d rlvlno=%02d bandno=%02d prcno=%02d cblkno=%03d passno=%03d\n"
                                          ,(ulong)uVar17,(ulong)uVar20,(ulong)uVar29,(ulong)uVar22,
                                          uVar27,uVar26,uVar10);
                              uVar18 = (int)uVar10 + 1;
                              uVar10 = (ulong)uVar18;
                              puVar28 = puVar28 + 0x12;
                            } while (uVar18 < pjVar23->numpasses);
                          }
                          uVar18 = (int)uVar26 + 1;
                          uVar26 = (ulong)uVar18;
                          pjVar23 = pjVar23 + 1;
                        } while (uVar18 < pjVar13->numcblks);
                      }
                      uVar18 = (int)uVar27 + 1;
                      uVar27 = (ulong)uVar18;
                      pjVar13 = pjVar13 + 1;
                    } while (uVar18 < pjVar16->numprcs);
                  }
                  uVar22 = uVar22 + 1;
                  pjVar12 = pjVar12 + 1;
                } while (uVar22 < pjVar16->numbands);
              }
              uVar29 = uVar29 + 1;
              pjVar16 = pjVar16 + 1;
            } while (uVar29 < pjVar11->numrlvls);
          }
          uVar20 = uVar20 + 1;
          pjVar11 = pjVar11 + 1;
        } while (uVar20 < pjVar2->numtcmpts);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < pjVar2->numlyrs);
  }
  jas_stream_close(stream);
  if (9 < iVar3) {
    jas_eprintf("finished rate allocation\n");
  }
  return 0;
LAB_00122265:
  if (bVar32) {
    return -1;
  }
  goto LAB_00122275;
}

Assistant:

int rateallocate(jpc_enc_t *enc, unsigned numlyrs, uint_fast32_t *cumlens)
{
	jpc_flt_t lo;
	jpc_flt_t hi;
	jas_stream_t *out;
	uint_fast32_t cumlen;
	jpc_flt_t thresh;
	jpc_flt_t goodthresh;
	int success;
	long pos;
	long oldpos;
	int numiters;

	jpc_enc_tcmpt_t *comp;
	jpc_enc_tcmpt_t *endcomps;
	jpc_enc_rlvl_t *lvl;
	jpc_enc_rlvl_t *endlvls;
	jpc_enc_band_t *band;
	jpc_enc_band_t *endbands;
	jpc_enc_cblk_t *cblk;
	jpc_enc_cblk_t *endcblks;
	jpc_enc_pass_t *pass;
	jpc_enc_pass_t *endpasses;
	jpc_enc_pass_t *pass1;
	jpc_flt_t mxrdslope;
	jpc_flt_t mnrdslope;
	jpc_enc_tile_t *tile;
	jpc_enc_prc_t *prc;
	unsigned prcno;

	JAS_DBGLOG(10, ("starting rate allocation\n"));

	tile = enc->curtile;

	for (unsigned lyrno = 1; lyrno < numlyrs - 1; ++lyrno) {
		if (cumlens[lyrno - 1] > cumlens[lyrno]) {
			abort();
		}
	}

	if (!(out = jas_stream_memopen(0, 0))) {
		return -1;
	}


	/* Find minimum and maximum R-D slope values. */
	mnrdslope = DBL_MAX;
	mxrdslope = 0;
	endcomps = &tile->tcmpts[tile->numtcmpts];
	for (comp = tile->tcmpts; comp != endcomps; ++comp) {
		endlvls = &comp->rlvls[comp->numrlvls];
		for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
			if (!lvl->bands) {
				continue;
			}
			endbands = &lvl->bands[lvl->numbands];
			for (band = lvl->bands; band != endbands; ++band) {
				if (!band->data) {
					continue;
				}
				for (prcno = 0, prc = band->prcs; prcno < lvl->numprcs;
				  ++prcno, ++prc) {
					if (!prc->cblks) {
						continue;
					}
					endcblks = &prc->cblks[prc->numcblks];
					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						calcrdslopes(cblk);
						endpasses = &cblk->passes[cblk->numpasses];
						for (pass = cblk->passes; pass != endpasses; ++pass) {
							if (pass->rdslope > 0) {
								if (pass->rdslope < mnrdslope) {
									mnrdslope = pass->rdslope;
								}
								if (pass->rdslope > mxrdslope) {
									mxrdslope = pass->rdslope;
								}
							}
						}
					}
				}
			}
		}
	}
	JAS_DBGLOG(10, ("min rdslope = %f max rdslope = %f\n", mnrdslope,
	  mxrdslope));

	jpc_init_t2state(enc, 1);

	for (unsigned lyrno = 0; lyrno < numlyrs; ++lyrno) {

		lo = mnrdslope;
		hi = mxrdslope;

		success = 0;
		goodthresh = 0;
		numiters = 0;

		do {

			cumlen = cumlens[lyrno];
			if (cumlen == UINT_FAST32_MAX) {
				/* Only the last layer can be free of a rate
				  constraint (e.g., for lossless coding). */
				assert(lyrno == numlyrs - 1);
				goodthresh = -1;
				success = 1;
				break;
			}

			thresh = (lo + hi) / 2;

			/* Save the tier 2 coding state. */
			jpc_save_t2state(enc);
			oldpos = jas_stream_tell(out);
			assert(oldpos >= 0);

			/* Assign all passes with R-D slopes greater than or
			  equal to the current threshold to this layer. */
			endcomps = &tile->tcmpts[tile->numtcmpts];
			for (comp = tile->tcmpts; comp != endcomps; ++comp) {
				endlvls = &comp->rlvls[comp->numrlvls];
				for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
					if (!lvl->bands) {
						continue;
					}
					endbands = &lvl->bands[lvl->numbands];
					for (band = lvl->bands; band != endbands; ++band) {
						if (!band->data) {
							continue;
						}
						for (prcno = 0, prc = band->prcs; prcno < lvl->numprcs;
						  ++prcno, ++prc) {
							if (!prc->cblks) {
								continue;
							}
							endcblks = &prc->cblks[prc->numcblks];
							for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
								if (cblk->curpass) {
									endpasses = &cblk->passes[cblk->numpasses];
									pass1 = cblk->curpass;
									for (pass = cblk->curpass; pass !=
									  endpasses; ++pass) {
										if (pass->rdslope >= thresh) {
											pass1 = &pass[1];
										}
									}
									for (pass = cblk->curpass; pass != pass1;
									  ++pass) {
										pass->lyrno = lyrno;
									}
									for (; pass != endpasses; ++pass) {
										pass->lyrno = -1;
									}
								}
							}
						}
					}
				}
			}

			/* Perform tier 2 coding. */
			endcomps = &tile->tcmpts[tile->numtcmpts];
			for (comp = tile->tcmpts; comp != endcomps; ++comp) {
				endlvls = &comp->rlvls[comp->numrlvls];
				for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
					if (!lvl->bands) {
						continue;
					}
					for (prcno = 0; prcno < lvl->numprcs; ++prcno) {
						if (jpc_enc_encpkt(enc, out, comp - tile->tcmpts,
						  lvl - comp->rlvls, prcno, lyrno)) {
							return -1;
						}
					}
				}
			}

			pos = jas_stream_tell(out);

			/* Check the rate constraint. */
			assert(pos >= 0);
			if ((uint_fast32_t)pos > cumlen) {
				/* The rate is too high. */
				lo = thresh;
			} else if ((uint_fast32_t)pos <= cumlen) {
				/* The rate is low enough, so try higher. */
				hi = thresh;
				if (!success || thresh < goodthresh) {
					goodthresh = thresh;
					success = 1;
				}
			}

			/* Save the tier 2 coding state. */
			jpc_restore_t2state(enc);
			if (jas_stream_seek(out, oldpos, SEEK_SET) < 0) {
				abort();
			}

			JAS_DBGLOG(10, ("maxlen=%08ld actuallen=%08ld thresh=%f\n",
			  cumlen, pos, thresh));

			++numiters;
		} while (lo < hi - 1e-3 && numiters < 32);

		if (!success) {
			jas_eprintf("warning: empty layer generated\n");
		}

		JAS_DBGLOG(10, ("success %d goodthresh %f\n", success, goodthresh));

		/* Assign all passes with R-D slopes greater than or
		  equal to the selected threshold to this layer. */
		endcomps = &tile->tcmpts[tile->numtcmpts];
		for (comp = tile->tcmpts; comp != endcomps; ++comp) {
			endlvls = &comp->rlvls[comp->numrlvls];
			for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
				if (!lvl->bands) {
					continue;
				}
				endbands = &lvl->bands[lvl->numbands];
				for (band = lvl->bands; band != endbands; ++band) {
					if (!band->data) {
						continue;
					}
					for (prcno = 0, prc = band->prcs; prcno < lvl->numprcs;
					  ++prcno, ++prc) {
						if (!prc->cblks) {
							continue;
						}
						endcblks = &prc->cblks[prc->numcblks];
						for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
							if (cblk->curpass) {
								endpasses = &cblk->passes[cblk->numpasses];
								pass1 = cblk->curpass;
								if (success) {
									for (pass = cblk->curpass; pass !=
									  endpasses; ++pass) {
										if (pass->rdslope >= goodthresh) {
											pass1 = &pass[1];
										}
									}
								}
								for (pass = cblk->curpass; pass != pass1;
								  ++pass) {
									pass->lyrno = lyrno;
								}
								for (; pass != endpasses; ++pass) {
									pass->lyrno = -1;
								}
							}
						}
					}
				}
			}
		}

		/* Perform tier 2 coding. */
		endcomps = &tile->tcmpts[tile->numtcmpts];
		for (comp = tile->tcmpts; comp != endcomps; ++comp) {
			endlvls = &comp->rlvls[comp->numrlvls];
			for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
				if (!lvl->bands) {
					continue;
				}
				for (prcno = 0; prcno < lvl->numprcs; ++prcno) {
					if (jpc_enc_encpkt(enc, out, comp - tile->tcmpts,
					  lvl - comp->rlvls, prcno, lyrno)) {
						return -1;
					}
				}
			}
		}
	}

	if (jas_getdbglevel() >= 5) {
		dump_layeringinfo(enc);
	}

	jas_stream_close(out);

	JAS_DBGLOG(10, ("finished rate allocation\n"));

	return 0;
}